

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

wchar_t edit_pathname(bsdtar *bsdtar,archive_entry *entry)

{
  char cVar1;
  int iVar2;
  char *name;
  char *pcVar3;
  char *pcVar4;
  wchar_t wVar5;
  char *name_00;
  bool bVar6;
  char *subst_name;
  char *local_38;
  
  name = archive_entry_pathname(entry);
  pcVar3 = archive_entry_hardlink(entry);
  iVar2 = apply_substitution(bsdtar,name,&subst_name,0,0);
  if (iVar2 == 1) {
    archive_entry_copy_pathname(entry,subst_name);
    cVar1 = *subst_name;
    free(subst_name);
    if (cVar1 == '\0') {
      return L'\xffffffff';
    }
    name = archive_entry_pathname(entry);
LAB_0010e396:
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      iVar2 = apply_substitution(bsdtar,pcVar3,&subst_name,0,1);
      if (iVar2 == 1) {
        archive_entry_copy_hardlink(entry,subst_name);
        free(subst_name);
      }
      else if (iVar2 == -1) goto LAB_0010e425;
      pcVar3 = archive_entry_hardlink(entry);
    }
    pcVar4 = archive_entry_symlink(entry);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = archive_entry_symlink(entry);
      iVar2 = apply_substitution(bsdtar,pcVar4,&subst_name,1,0);
      if (iVar2 == 1) {
        archive_entry_copy_symlink(entry,subst_name);
        free(subst_name);
      }
      else if (iVar2 == -1) {
LAB_0010e425:
        lafe_warnc(0,"Invalid substitution, skipping entry");
        return L'\x01';
      }
    }
    wVar5 = bsdtar->strip_components;
    pcVar4 = name;
    local_38 = pcVar3;
    if (L'\0' < wVar5) {
      pcVar4 = strip_components(name,wVar5);
      if (pcVar4 == (char *)0x0) {
        return L'\x01';
      }
      if (local_38 == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = strip_components(local_38,wVar5);
        if (pcVar3 == (char *)0x0) {
          return L'\x01';
        }
      }
    }
    if ((bsdtar->flags & 2) == 0) {
      pcVar4 = strip_absolute_path(bsdtar,pcVar4);
      name_00 = ".";
      if (*pcVar4 != '\0') {
        name_00 = pcVar4;
      }
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = strip_absolute_path(bsdtar,pcVar3);
        if (*pcVar3 == '\0') goto LAB_0010e368;
      }
    }
    else {
      bVar6 = *pcVar4 == '/';
      do {
        name_00 = pcVar4;
        if (!bVar6) break;
        bVar6 = true;
        pcVar4 = name_00 + 1;
      } while (name_00[1] == '/');
    }
    pcVar4 = local_38;
    if (name_00 != name) {
      archive_entry_copy_pathname(entry,name_00);
    }
    wVar5 = L'\0';
    if (pcVar3 != pcVar4) {
      archive_entry_copy_hardlink(entry,pcVar3);
    }
  }
  else {
    if (iVar2 != -1) goto LAB_0010e396;
    lafe_warnc(0,"Invalid substitution, skipping entry");
LAB_0010e368:
    wVar5 = L'\x01';
  }
  return wVar5;
}

Assistant:

int
edit_pathname(struct bsdtar *bsdtar, struct archive_entry *entry)
{
	const char *name = archive_entry_pathname(entry);
	const char *original_name = name;
	const char *hardlinkname = archive_entry_hardlink(entry);
	const char *original_hardlinkname = hardlinkname;
#if defined(HAVE_REGEX_H) || defined(HAVE_PCREPOSIX_H) || defined(HAVE_PCRE2POSIX_H)
	char *subst_name;
	int r;

	/* Apply user-specified substitution to pathname. */
	r = apply_substitution(bsdtar, name, &subst_name, 0, 0);
	if (r == -1) {
		lafe_warnc(0, "Invalid substitution, skipping entry");
		return 1;
	}
	if (r == 1) {
		archive_entry_copy_pathname(entry, subst_name);
		if (*subst_name == '\0') {
			free(subst_name);
			return -1;
		} else
			free(subst_name);
		name = archive_entry_pathname(entry);
		original_name = name;
	}

	/* Apply user-specified substitution to hardlink target. */
	if (hardlinkname != NULL) {
		r = apply_substitution(bsdtar, hardlinkname, &subst_name, 0, 1);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_hardlink(entry, subst_name);
			free(subst_name);
		}
		hardlinkname = archive_entry_hardlink(entry);
		original_hardlinkname = hardlinkname;
	}

	/* Apply user-specified substitution to symlink body. */
	if (archive_entry_symlink(entry) != NULL) {
		r = apply_substitution(bsdtar, archive_entry_symlink(entry), &subst_name, 1, 0);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_symlink(entry, subst_name);
			free(subst_name);
		}
	}
#endif

	/* Strip leading dir names as per --strip-components option. */
	if (bsdtar->strip_components > 0) {
		name = strip_components(name, bsdtar->strip_components);
		if (name == NULL)
			return (1);

		if (hardlinkname != NULL) {
			hardlinkname = strip_components(hardlinkname,
			    bsdtar->strip_components);
			if (hardlinkname == NULL)
				return (1);
		}
	}

	if ((bsdtar->flags & OPTFLAG_ABSOLUTE_PATHS) == 0) {
		/* By default, don't write or restore absolute pathnames. */
		name = strip_absolute_path(bsdtar, name);
		if (*name == '\0')
			name = ".";

		if (hardlinkname != NULL) {
			hardlinkname = strip_absolute_path(bsdtar, hardlinkname);
			if (*hardlinkname == '\0')
				return (1);
		}
	} else {
		/* Strip redundant leading '/' characters. */
		while (name[0] == '/' && name[1] == '/')
			name++;
	}

	/* Replace name in archive_entry. */
	if (name != original_name) {
		archive_entry_copy_pathname(entry, name);
	}
	if (hardlinkname != original_hardlinkname) {
		archive_entry_copy_hardlink(entry, hardlinkname);
	}
	return (0);
}